

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall IMLE::loadParameters(IMLE *this,string *fname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  xml_iarchive ia;
  Param newParams;
  ifstream ifs;
  
  Param::Param(&newParams,this->d,this->D);
  std::ifstream::ifstream(&ifs,(fname->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_380,"IMLE: Could not open file ",fname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ia,
                   &local_380,"!!");
    message(this,(string *)&ia);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive(&ia,(istream *)&ifs,0);
    local_380._M_dataplus._M_p = "newParams";
    local_380._M_string_length = (size_type)&newParams;
    boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<IMLE::Param>
              ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&ia,
               (nvp<IMLE::Param> *)&local_380);
    std::ifstream::close();
    setParameters(this,&newParams);
    boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
              (&ia.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  }
  std::ifstream::~ifstream(&ifs);
  Param::~Param(&newParams);
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}